

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O1

state parse_url_char(state s,char ch)

{
  uint uVar1;
  state sVar2;
  state sVar3;
  undefined7 in_register_00000031;
  
  if (((uint)CONCAT71(in_register_00000031,ch) < 0x21) &&
     ((0x100003600U >> ((ulong)(byte)ch & 0x3f) & 1) != 0)) {
    return s_dead;
  }
  switch(s) {
  case s_req_spaces_before_url:
    sVar3 = s_req_path;
    if (((ch != '*') && (ch != '/')) && (sVar3 = s_req_schema, 0x19 < (byte)((ch | 0x20U) + 0x9f)))
    {
      return s_dead;
    }
    break;
  case s_req_schema:
    sVar3 = s_req_schema;
    if ((0x19 < (byte)((ch | 0x20U) + 0x9f)) && (sVar3 = s_req_schema_slash, ch != ':')) {
      return s_dead;
    }
    break;
  case s_req_schema_slash:
    sVar3 = s_req_schema_slash_slash;
    goto LAB_0011f1f3;
  case s_req_schema_slash_slash:
    sVar3 = s_req_server_start;
LAB_0011f1f3:
    if (ch != '/') {
switchD_0011f0dc_default:
      return s_dead;
    }
    break;
  case s_req_server_start:
  case s_req_server:
    if (ch == '@') {
      return s_req_server_with_at;
    }
    if (ch == '?') {
      return s_req_query_string_start;
    }
    if (ch == '/') {
      return s_req_path;
    }
    goto LAB_0011f15d;
  case s_req_server_with_at:
    if (ch == '/') {
      return s_req_path;
    }
    if (ch == '?') {
      return s_req_query_string_start;
    }
    if (ch == '@') {
      return s_dead;
    }
LAB_0011f15d:
    if ((byte)(ch - 0x30U) < 10) {
      return s_req_server;
    }
    if (0x19 < (byte)((ch | 0x20U) + 0x9f)) {
      uVar1 = (int)ch - 0x21;
      if ((uVar1 < 0x3f) && ((0x5400000016003ff9U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
        return s_req_server;
      }
      if (ch != 0x7e) {
        return s_dead;
      }
      return s_req_server;
    }
    return s_req_server;
  case s_req_path:
    sVar3 = s_req_path;
    if ((""[(byte)ch >> 3] >> ((byte)ch & 7) & 1) == 0) {
      sVar3 = s_dead;
      if (ch == '#') {
        sVar3 = s_req_fragment_start;
      }
      sVar2 = s_req_query_string_start;
LAB_0011f2de:
      if (ch != '?') {
        sVar2 = sVar3;
      }
      return sVar2;
    }
    break;
  case s_req_query_string_start:
  case s_req_query_string:
    sVar3 = s_req_query_string;
    if ((""[(byte)ch >> 3] >> ((byte)ch & 7) & 1) == 0) {
      sVar3 = s_dead;
      if (ch == '#') {
        sVar3 = s_req_fragment_start;
      }
      sVar2 = s_req_query_string;
      goto LAB_0011f2de;
    }
    break;
  case s_req_fragment_start:
    sVar3 = s_req_fragment;
    if ((""[(byte)ch >> 3] >> ((byte)ch & 7) & 1) == 0) {
      sVar3 = s_dead;
      if (ch == '#') {
        sVar3 = s_req_fragment_start;
      }
      sVar2 = s_req_fragment;
      goto LAB_0011f2de;
    }
    break;
  case s_req_fragment:
    sVar3 = s_req_fragment;
    if ((""[(byte)ch >> 3] >> ((byte)ch & 7) & 1) == 0) {
      sVar3 = s_dead;
      if (ch == '#') {
        sVar3 = s_req_fragment;
      }
      if (ch == '?') {
        sVar3 = s_req_fragment;
      }
      return sVar3;
    }
    break;
  default:
    goto switchD_0011f0dc_default;
  }
  return sVar3;
}

Assistant:

static enum state
parse_url_char(enum state s, const char ch)
{
  if (ch == ' ' || ch == '\r' || ch == '\n') {
    return s_dead;
  }

#if HTTP_PARSER_STRICT
  if (ch == '\t' || ch == '\f') {
    return s_dead;
  }
#endif

  switch (s) {
    case s_req_spaces_before_url:
      /* Proxied requests are followed by scheme of an absolute URI (alpha).
       * All methods except CONNECT are followed by '/' or '*'.
       */

      if (ch == '/' || ch == '*') {
        return s_req_path;
      }

      if (IS_ALPHA(ch)) {
        return s_req_schema;
      }

      break;

    case s_req_schema:
      if (IS_ALPHA(ch)) {
        return s;
      }

      if (ch == ':') {
        return s_req_schema_slash;
      }

      break;

    case s_req_schema_slash:
      if (ch == '/') {
        return s_req_schema_slash_slash;
      }

      break;

    case s_req_schema_slash_slash:
      if (ch == '/') {
        return s_req_server_start;
      }

      break;

    case s_req_server_with_at:
      if (ch == '@') {
        return s_dead;
      }

    /* FALLTHROUGH */
    case s_req_server_start:
    case s_req_server:
      if (ch == '/') {
        return s_req_path;
      }

      if (ch == '?') {
        return s_req_query_string_start;
      }

      if (ch == '@') {
        return s_req_server_with_at;
      }

      if (IS_USERINFO_CHAR(ch) || ch == '[' || ch == ']') {
        return s_req_server;
      }

      break;

    case s_req_path:
      if (IS_URL_CHAR(ch)) {
        return s;
      }

      switch (ch) {
        case '?':
          return s_req_query_string_start;

        case '#':
          return s_req_fragment_start;
      }

      break;

    case s_req_query_string_start:
    case s_req_query_string:
      if (IS_URL_CHAR(ch)) {
        return s_req_query_string;
      }

      switch (ch) {
        case '?':
          /* allow extra '?' in query string */
          return s_req_query_string;

        case '#':
          return s_req_fragment_start;
      }

      break;

    case s_req_fragment_start:
      if (IS_URL_CHAR(ch)) {
        return s_req_fragment;
      }

      switch (ch) {
        case '?':
          return s_req_fragment;

        case '#':
          return s;
      }

      break;

    case s_req_fragment:
      if (IS_URL_CHAR(ch)) {
        return s;
      }

      switch (ch) {
        case '?':
        case '#':
          return s;
      }

      break;

    default:
      break;
  }

  /* We should never fall out of the switch above unless there's an error */
  return s_dead;
}